

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint *puVar1;
  byte bVar2;
  uint32 uVar3;
  uint32 uVar4;
  LogMessage *pLVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7f6);
    pLVar5 = LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_61,pLVar5);
    LogMessage::~LogMessage(&local_60);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar3 = ReflectionSchema::HasBitIndex(&this->schema_,field);
    bVar2 = (byte)uVar3 & 0x1f;
    if ((this->schema_).has_bits_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x77c);
      pLVar5 = LogMessage::operator<<(&local_60,"CHECK failed: schema_.HasHasbits(): ");
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    uVar4 = ReflectionSchema::HasBitsOffset(&this->schema_);
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar3 >> 5) * 4 + (ulong)uVar4);
    *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::ClearBit(
    Message* message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] &=
      ~(static_cast<uint32>(1) << (index % 32));
}